

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

uv__io_uring_sqe * uv__iou_get_sqe(uv__iou *iou,uv_loop_t *loop,uv_fs_t *req)

{
  uint uVar1;
  uint32_t slot;
  uint32_t mask;
  uint32_t tail;
  uint32_t head;
  uv__io_uring_sqe *sqe;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  uv__iou *iou_local;
  
  if (iou->ringfd == -1) {
    iou_local = (uv__iou *)0x0;
  }
  else {
    uVar1 = iou->sqmask;
    if ((*iou->sqhead & uVar1) == (*iou->sqtail + 1 & uVar1)) {
      iou_local = (uv__iou *)0x0;
    }
    else {
      iou_local = (uv__iou *)((long)iou->sqe + (ulong)(*iou->sqtail & uVar1) * 0x40);
      memset(iou_local,0,0x40);
      iou_local->sqflags = (uint32_t *)req;
      (req->work_req).loop = loop;
      (req->work_req).work = (_func_void_uv__work_ptr *)0x0;
      (req->work_req).done = (_func_void_uv__work_ptr_int *)0x0;
      uv__queue_init(&(req->work_req).wq);
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      iou->in_flight = iou->in_flight + 1;
    }
  }
  return (uv__io_uring_sqe *)iou_local;
}

Assistant:

static struct uv__io_uring_sqe* uv__iou_get_sqe(struct uv__iou* iou,
                                                uv_loop_t* loop,
                                                uv_fs_t* req) {
  struct uv__io_uring_sqe* sqe;
  uint32_t head;
  uint32_t tail;
  uint32_t mask;
  uint32_t slot;

  if (iou->ringfd == -1)
    return NULL;

  head = atomic_load_explicit((_Atomic uint32_t*) iou->sqhead,
                              memory_order_acquire);
  tail = *iou->sqtail;
  mask = iou->sqmask;

  if ((head & mask) == ((tail + 1) & mask))
    return NULL;  /* No room in ring buffer. TODO(bnoordhuis) maybe flush it? */

  slot = tail & mask;
  sqe = iou->sqe;
  sqe = &sqe[slot];
  memset(sqe, 0, sizeof(*sqe));
  sqe->user_data = (uintptr_t) req;

  /* Pacify uv_cancel(). */
  req->work_req.loop = loop;
  req->work_req.work = NULL;
  req->work_req.done = NULL;
  uv__queue_init(&req->work_req.wq);

  uv__req_register(loop, req);
  iou->in_flight++;

  return sqe;
}